

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  pwVar7 = *it;
  if (0 < *(long *)(this + 0x10)) {
    pcVar10 = *(char **)(this + 8);
    uVar9 = *(long *)(this + 0x10) + 1;
    do {
      *pwVar7 = (int)*pcVar10;
      pcVar10 = pcVar10 + 1;
      pwVar7 = pwVar7 + 1;
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  auVar6 = _DAT_00154440;
  auVar5 = _DAT_00150900;
  auVar4 = _DAT_001508f0;
  lVar2 = *(long *)(this + 0x20);
  pwVar8 = pwVar7;
  if (lVar2 != 0) {
    pwVar8 = pwVar7 + lVar2;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar9 = lVar2 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar12._8_4_ = (int)uVar9;
    auVar12._0_8_ = uVar9;
    auVar12._12_4_ = (int)(uVar9 >> 0x20);
    lVar11 = 0;
    auVar12 = auVar12 ^ _DAT_00150900;
    do {
      auVar14._8_4_ = (int)lVar11;
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        pwVar7[lVar11] = wVar1;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        pwVar7[lVar11 + 1] = wVar1;
      }
      auVar14 = (auVar14 | auVar6) ^ auVar5;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        pwVar7[lVar11 + 2] = wVar1;
        pwVar7[lVar11 + 3] = wVar1;
      }
      lVar11 = lVar11 + 4;
    } while ((uVar9 - ((uint)(lVar2 + 0x3fffffffffffffffU) & 3)) + 4 != lVar11);
  }
  iVar13 = *(int *)(this + 0x30);
  pwVar7 = pwVar8 + iVar13;
  uVar9 = *(ulong *)(this + 0x28);
  do {
    pwVar7 = pwVar7 + -1;
    *pwVar7 = (uint)uVar9 & 7 | 0x30;
    bVar3 = 7 < uVar9;
    uVar9 = uVar9 >> 3;
  } while (bVar3);
  *it = pwVar8 + iVar13;
  return;
}

Assistant:

FMT_CONSTEXPR iterator begin() const { return data_; }